

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

Construct * __thiscall
spvtools::val::Function::AddConstruct(Function *this,Construct *new_construct)

{
  BasicBlock *pBVar1;
  mapped_type *ppCVar2;
  mapped_type pCVar3;
  key_type local_30;
  
  std::__cxx11::list<spvtools::val::Construct,std::allocator<spvtools::val::Construct>>::
  _M_insert<spvtools::val::Construct_const&>
            ((list<spvtools::val::Construct,std::allocator<spvtools::val::Construct>> *)
             &this->cfg_constructs_,(iterator)&this->cfg_constructs_,new_construct);
  pCVar3 = (mapped_type)
           ((this->cfg_constructs_).
            super__List_base<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_>.
            _M_impl._M_node.super__List_node_base._M_prev + 1);
  pBVar1 = Construct::entry_block(new_construct);
  local_30.second = Construct::type(new_construct);
  local_30.first = pBVar1;
  ppCVar2 = std::__detail::
            _Map_base<std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>,_std::allocator<std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>_>,_spvtools::val::bb_constr_type_pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>,_std::allocator<std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>_>,_spvtools::val::bb_constr_type_pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->entry_block_to_construct_,&local_30);
  *ppCVar2 = pCVar3;
  return pCVar3;
}

Assistant:

Construct& Function::AddConstruct(const Construct& new_construct) {
  cfg_constructs_.push_back(new_construct);
  auto& result = cfg_constructs_.back();
  entry_block_to_construct_[std::make_pair(new_construct.entry_block(),
                                           new_construct.type())] = &result;
  return result;
}